

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

npy_api * pybind11::detail::npy_api::lookup(void)

{
  uint uVar1;
  PyObject *reason;
  long lVar2;
  npy_api *in_RDI;
  void **api_ptr;
  str_attr_accessor c;
  module_ m;
  char *in_stack_ffffffffffffffa0;
  npy_api *this;
  char local_8 [8];
  
  this = in_RDI;
  module_::import(local_8);
  object_api<pybind11::handle>::attr((object_api<pybind11::handle> *)this,in_stack_ffffffffffffffa0)
  ;
  reason = accessor<pybind11::detail::accessor_policies::str_attr>::ptr
                     ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2c6b76);
  lVar2 = PyCapsule_GetPointer(reason,0);
  this->PyArray_GetNDArrayCFeatureVersion_ = *(_func_uint **)(lVar2 + 0x698);
  uVar1 = (*this->PyArray_GetNDArrayCFeatureVersion_)();
  if (uVar1 < 7) {
    pybind11_fail((char *)reason);
  }
  this->PyArray_Type_ = *(PyTypeObject **)(lVar2 + 0x10);
  this->PyVoidArrType_Type_ = *(PyTypeObject **)(lVar2 + 0x138);
  this->PyArrayDescr_Type_ = *(PyTypeObject **)(lVar2 + 0x18);
  this->PyArray_DescrFromType_ = *(_func_PyObject_ptr_int **)(lVar2 + 0x168);
  this->PyArray_DescrFromScalar_ = *(_func_PyObject_ptr_PyObject_ptr **)(lVar2 + 0x1c8);
  this->PyArray_FromAny_ =
       *(_func_PyObject_ptr_PyObject_ptr_PyObject_ptr_int_int_int_PyObject_ptr **)(lVar2 + 0x228);
  this->PyArray_Resize_ =
       *(_func_PyObject_ptr_PyObject_ptr_PyArray_Dims_ptr_int_int **)(lVar2 + 0x280);
  this->PyArray_CopyInto_ = *(_func_int_PyObject_ptr_PyObject_ptr **)(lVar2 + 0x290);
  this->PyArray_NewCopy_ = *(_func_PyObject_ptr_PyObject_ptr_int **)(lVar2 + 0x2a8);
  this->PyArray_NewFromDescr_ =
       *(_func_PyObject_ptr_PyTypeObject_ptr_PyObject_ptr_int_Py_intptr_t_ptr_Py_intptr_t_ptr_void_ptr_int_PyObject_ptr
         **)(lVar2 + 0x2f0);
  this->PyArray_DescrNewFromType_ = *(_func_PyObject_ptr_int **)(lVar2 + 0x300);
  this->PyArray_Newshape_ =
       *(_func_PyObject_ptr_PyObject_ptr_PyArray_Dims_ptr_int **)(lVar2 + 0x438);
  this->PyArray_Squeeze_ = *(_func_PyObject_ptr_PyObject_ptr **)(lVar2 + 0x440);
  this->PyArray_View_ =
       *(_func_PyObject_ptr_PyObject_ptr_PyObject_ptr_PyObject_ptr **)(lVar2 + 0x448);
  this->PyArray_DescrConverter_ = *(_func_int_PyObject_ptr_PyObject_ptr_ptr **)(lVar2 + 0x570);
  this->PyArray_EquivTypes_ = *(_func_bool_PyObject_ptr_PyObject_ptr **)(lVar2 + 0x5b0);
  this->PyArray_GetArrayParamsFromObject_ =
       *(_func_int_PyObject_ptr_PyObject_ptr_uchar_PyObject_ptr_ptr_int_ptr_Py_intptr_t_ptr_PyObject_ptr_ptr_PyObject_ptr
         **)(lVar2 + 0x8b0);
  this->PyArray_SetBaseObject_ = *(_func_int_PyObject_ptr_PyObject_ptr **)(lVar2 + 0x8d0);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x2c6d34);
  module_::~module_((module_ *)0x2c6d3e);
  return in_RDI;
}

Assistant:

static npy_api lookup() {
        module_ m = module_::import("numpy.core.multiarray");
        auto c = m.attr("_ARRAY_API");
        void **api_ptr = (void **) PyCapsule_GetPointer(c.ptr(), nullptr);
        npy_api api;
#define DECL_NPY_API(Func) api.Func##_ = (decltype(api.Func##_)) api_ptr[API_##Func];
        DECL_NPY_API(PyArray_GetNDArrayCFeatureVersion);
        if (api.PyArray_GetNDArrayCFeatureVersion_() < 0x7) {
            pybind11_fail("pybind11 numpy support requires numpy >= 1.7.0");
        }
        DECL_NPY_API(PyArray_Type);
        DECL_NPY_API(PyVoidArrType_Type);
        DECL_NPY_API(PyArrayDescr_Type);
        DECL_NPY_API(PyArray_DescrFromType);
        DECL_NPY_API(PyArray_DescrFromScalar);
        DECL_NPY_API(PyArray_FromAny);
        DECL_NPY_API(PyArray_Resize);
        DECL_NPY_API(PyArray_CopyInto);
        DECL_NPY_API(PyArray_NewCopy);
        DECL_NPY_API(PyArray_NewFromDescr);
        DECL_NPY_API(PyArray_DescrNewFromType);
        DECL_NPY_API(PyArray_Newshape);
        DECL_NPY_API(PyArray_Squeeze);
        DECL_NPY_API(PyArray_View);
        DECL_NPY_API(PyArray_DescrConverter);
        DECL_NPY_API(PyArray_EquivTypes);
        DECL_NPY_API(PyArray_GetArrayParamsFromObject);
        DECL_NPY_API(PyArray_SetBaseObject);

#undef DECL_NPY_API
        return api;
    }